

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

bool __thiscall Clasp::DefaultMinimize::propagateImpl(DefaultMinimize *this,Solver *s,PropMode m)

{
  uint uVar1;
  SharedData *pSVar2;
  SharedMinimizeData *this_00;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  Iter p;
  uint32 level;
  bool bVar7;
  uint32 undoPos;
  uint local_5c;
  uint32 local_54;
  wsum_t *local_50;
  wsum_t *local_48;
  uint32 *local_40;
  Antecedent local_38;
  
  pSVar2 = (this->super_MinimizeConstraint).shared_;
  p = this->pos_;
  uVar5 = (ulong)((long)p + (-0x68 - (long)pSVar2)) >> 3;
  local_5c = (s->levels_).super_type.ebo_.size;
  local_54 = this->undoTop_;
  uVar4 = 0;
  if ((pSVar2->adjust_).ebo_.size != 1) {
    uVar4 = *(uint *)((pSVar2->weights).ebo_.buf +
                     *(uint *)((long)pSVar2[1].up_ + (uVar5 & 0xffffffff) * 8 + -0xc)) & 0x7fffffff;
  }
  level = (m == propagate_new_opt) + local_5c;
  uVar6 = this->actLev_;
  if (uVar4 < this->actLev_) {
    uVar6 = uVar4;
  }
  local_40 = &this->actLev_;
  this->actLev_ = uVar6;
  local_48 = this->bounds_;
  local_50 = local_48 + this->size_;
  uVar4 = 0xffffffff;
LAB_0015096b:
  uVar6 = (p->first).rep_;
  bVar7 = uVar6 < 4;
  if (bVar7) {
    return bVar7;
  }
  do {
    if ((-1 < (int)this->undo_[uVar5 & 0xffffffff].rep) &&
       ((m != propagate_new_sum ||
        ((byte)(*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar6 & 0xfffffffc)) & 3) !=
         (byte)(((uVar6 & 2) == 0) + 1U))))) {
      uVar1 = p->second;
      if (uVar4 != uVar1) {
        this_00 = (this->super_MinimizeConstraint).shared_;
        if ((this_00->weights).ebo_.size == 0) {
          if ((long)(int)uVar1 + *local_50 <= *local_48) goto LAB_00150ade;
        }
        else {
          bVar3 = SharedMinimizeData::imp
                            (this_00,local_50,(this_00->weights).ebo_.buf + uVar1,local_48,local_40)
          ;
          if (!bVar3) {
LAB_00150ade:
            this->pos_ = p;
            return true;
          }
        }
        if (m == propagate_new_opt) {
          level = computeImplicationSet(this,s,p,&local_54);
        }
        uVar6 = (p->first).rep_;
        uVar4 = p->second;
      }
      uVar1 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar6 & 0xfffffffc));
      if (((byte)((byte)uVar1 & 3) != (byte)(((uVar6 & 2) == 0) + 1U)) ||
         ((level < local_5c && (level < uVar1 >> 4)))) break;
    }
    uVar5 = (ulong)((int)uVar5 + 1);
    uVar6 = p[1].first.rep_;
    p = p + 1;
    if (uVar6 < 4) {
      return true;
    }
  } while( true );
  if (level != local_5c) {
    local_5c = Solver::undoUntil(s,level,1);
    uVar6 = (p->first).rep_;
  }
  local_38.data_ = (uint64)this;
  bVar3 = Solver::force(s,(Literal)(uVar6 & 0xfffffffe ^ 2),level,&local_38,local_54);
  p = p + 1;
  uVar5 = (ulong)((int)uVar5 + 1);
  if (!bVar3) {
    return bVar7;
  }
  goto LAB_0015096b;
}

Assistant:

bool DefaultMinimize::propagateImpl(Solver& s, PropMode m) {
	Iter it    = pos_;
	uint32 idx = static_cast<uint32>(it - shared_->lits);
	uint32 DL  = s.decisionLevel();
	// current implication level or "unknown" if
	// we propagate a new optimum
	uint32 impLevel = DL + (m == propagate_new_opt);
	weight_t lastW  = -1;
	uint32 undoPos  = undoTop_;
	bool ok         = true;
	actLev_         = std::min(actLev_, shared_->level(idx));
	for (wsum_t* sum= this->sum(), *opt = this->opt(); ok && !isSentinel(it->first); ++it, ++idx) {
		// skip propagated/false literals
		if (litSeen(idx) || (m == propagate_new_sum && s.isFalse(it->first))) {
			continue;
		}
		if (lastW != it->second) {
			// check if the current weight is implied
			if (!STRATEGY(imp(sum, *it, opt, actLev_))) {
				// all good - current optimum is safe
				pos_    = it;
				return true;
			}
			// compute implication set and level of current weight
			if (m == propagate_new_opt) {
				impLevel = computeImplicationSet(s, *it, undoPos);
			}
			lastW = it->second;
		}
		assert(active());
		// force implied literals
		if (!s.isFalse(it->first) || (impLevel < DL && s.level(it->first.var()) > impLevel)) {
			if (impLevel != DL) { DL = s.undoUntil(impLevel, Solver::undo_pop_bt_level); }
			ok = s.force(~it->first, impLevel, this, undoPos);
		}
	}
	return ok;
}